

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O2

string * __thiscall
HttpTestListener::GetRequestQuery
          (string *__return_storage_ptr__,HttpTestListener *this,string *query_name)

{
  iterator iVar1;
  allocator<char> local_11;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->map_request_query_)._M_t,query_name);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->map_request_query_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(iVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpTestListener::GetRequestQuery(std::string query_name) {
  std::map<std::string, std::string>::iterator it = this->map_request_query_.find(query_name);
  if(it == this->map_request_query_.end()) {
    return "";
  } else {
    return it->second;
  }
}